

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tools.c
# Opt level: O3

void AbsPathNormalize(tchar_t *Abs)

{
  tchar_t *ptVar1;
  tchar_t *i;
  
  ptVar1 = GetProtocol(Abs,(tchar_t *)0x0,0,(bool_t *)0x0);
  if (ptVar1 == Abs) {
    return;
  }
  do {
    if (*Abs == '\\') {
      *Abs = '/';
    }
    else if (*Abs == '\0') {
      return;
    }
    Abs = Abs + 1;
  } while( true );
}

Assistant:

void AbsPathNormalize(tchar_t* Abs)
{
    if (GetProtocol(Abs,NULL,0,NULL)!=Abs)
    {
        tchar_t *i;
        for (i=Abs;*i;++i)
            if (*i == '\\')
                *i = '/';
    }
    else
    {
#if defined(TARGET_WIN)
        tchar_t *i;
        for (i=Abs;*i;++i)
            if (*i == '/')
                *i = '\\';
#endif
    }
}